

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall
cashew::JSPrinter::printChild(JSPrinter *this,Ref child,Ref parent,int childPosition)

{
  size_t sVar1;
  bool bVar2;
  
  bVar2 = needParens(this,parent,child,childPosition);
  if (bVar2) {
    maybeSpace(this,'(');
    ensure(this,1);
    sVar1 = this->used;
    this->used = sVar1 + 1;
    this->buffer[sVar1] = '(';
    print(this,child);
    maybeSpace(this,')');
    ensure(this,1);
    sVar1 = this->used;
    this->used = sVar1 + 1;
    this->buffer[sVar1] = ')';
    return;
  }
  print(this,child);
  return;
}

Assistant:

void printChild(Ref child, Ref parent, int childPosition = 0) {
    bool parens = needParens(parent, child, childPosition);
    if (parens) {
      emit('(');
    }
    print(child);
    if (parens) {
      emit(')');
    }
  }